

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unz64local_getLong64(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,ZPOS64_T *pX)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int i;
  uint local_54;
  voidpf local_50;
  long local_48;
  ulong local_40;
  ulong *local_38;
  
  local_54 = 0;
  local_38 = pX;
  iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)&local_54);
  local_40 = (ulong)(int)local_54;
  if (iVar1 == 0) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)&local_54);
    bVar8 = iVar1 == 0;
  }
  else {
    bVar8 = false;
  }
  lVar6 = (long)(int)local_54;
  if (bVar8) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)&local_54);
    bVar8 = iVar1 == 0;
  }
  else {
    bVar8 = false;
  }
  local_48 = (long)(int)local_54;
  if (bVar8) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)&local_54);
    bVar8 = iVar1 == 0;
  }
  else {
    bVar8 = false;
  }
  lVar3 = (long)(int)local_54;
  if (bVar8) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)&local_54);
    bVar8 = iVar1 == 0;
  }
  else {
    bVar8 = false;
  }
  lVar5 = (long)(int)local_54;
  if (bVar8) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)&local_54);
    bVar8 = iVar1 == 0;
  }
  else {
    bVar8 = false;
  }
  uVar4 = (ulong)local_54;
  local_50 = filestream;
  if (bVar8) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)&local_54);
    bVar8 = iVar1 == 0;
  }
  else {
    bVar8 = false;
  }
  uVar7 = (ulong)local_54;
  iVar1 = -1;
  if (bVar8) {
    iVar1 = unz64local_getByte(pzlib_filefunc_def,local_50,(int *)&local_54);
  }
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar2 = (ulong)local_54 << 0x38 |
            uVar7 << 0x30 | uVar4 << 0x28 | lVar5 << 0x20 |
            lVar3 << 0x18 | local_48 << 0x10 | lVar6 << 8 | local_40;
  }
  *local_38 = uVar2;
  return iVar1;
}

Assistant:

local int unz64local_getLong64(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    ZPOS64_T* pX)
{
    ZPOS64_T x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (ZPOS64_T)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 8;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 16;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 24;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 32;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 40;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 48;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 56;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}